

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.cpp
# Opt level: O1

void DrawerCommandQueue::ReportDrawerError
               (DrawerCommand *command,bool worker_thread,char *reason,bool fatal)

{
  undefined7 in_register_00000031;
  unique_lock<std::mutex> end_lock;
  unique_lock<std::mutex> local_58;
  FString local_48;
  FString local_40;
  FString local_38;
  FString local_30;
  
  if ((int)CONCAT71(in_register_00000031,worker_thread) != 0) {
    Instance();
    local_58._M_device = &Instance::queue.end_mutex;
    local_58._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_58);
    local_58._M_owns = true;
    Instance();
    if ((*(int *)(Instance::queue.thread_error.Chars + -0xc) == 0) ||
       ((Instance(), fatal && (Instance::queue.thread_error_fatal == false)))) {
      FString::FString(&local_40,": ");
      operator+((char *)&local_38,(FString *)reason);
      (*command->_vptr_DrawerCommand[3])(&local_48,command);
      FString::operator+(&local_30,&local_38);
      Instance();
      FString::operator=(&Instance::queue.thread_error,&local_30);
      FString::~FString(&local_30);
      FString::~FString(&local_48);
      FString::~FString(&local_38);
      FString::~FString(&local_40);
      Instance();
      Instance::queue.thread_error_fatal = fatal;
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_58);
    return;
  }
  if (fatal) {
    (*command->_vptr_DrawerCommand[3])(&local_58,command);
    I_FatalError("%s: %s",reason,local_58._M_device);
  }
  else {
    if (ReportDrawerError(DrawerCommand*,bool,char_const*,bool)::first != '\0') {
      ReportDrawerError(DrawerCommand*,bool,char_const*,bool)::first = '\x01';
      return;
    }
    (*command->_vptr_DrawerCommand[3])(&local_58,command);
    Printf("%s: %s\n",reason,local_58._M_device);
  }
  FString::~FString((FString *)&local_58);
  ReportDrawerError(DrawerCommand*,bool,char_const*,bool)::first = '\x01';
  return;
}

Assistant:

void DrawerCommandQueue::ReportDrawerError(DrawerCommand *command, bool worker_thread, const char *reason, bool fatal)
{
	if (worker_thread)
	{
		std::unique_lock<std::mutex> end_lock(Instance()->end_mutex);
		if (Instance()->thread_error.IsEmpty() || (!Instance()->thread_error_fatal && fatal))
		{
			Instance()->thread_error = reason + (FString)": " + command->DebugInfo();
			Instance()->thread_error_fatal = fatal;
		}
	}
	else
	{
		static bool first = true;
		if (fatal)
			I_FatalError("%s: %s", reason, command->DebugInfo().GetChars());
		else if (first)
			Printf("%s: %s\n", reason, command->DebugInfo().GetChars());
		first = false;
	}
}